

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int ARKodeSetRootDirection(void *arkode_mem,int *rootdir)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar3 = 0x511;
  }
  else {
    lVar1 = *(long *)((long)arkode_mem + 0x3a0);
    if (lVar1 == 0) {
      msgfmt = "arkode_mem = NULL illegal.";
      error_code = -0x15;
      iVar3 = 0x518;
    }
    else {
      iVar3 = *(int *)(lVar1 + 8);
      if (iVar3 != 0) {
        for (lVar2 = 0; lVar2 < iVar3; lVar2 = lVar2 + 1) {
          *(int *)(*(long *)(lVar1 + 0x18) + lVar2 * 4) = rootdir[lVar2];
          iVar3 = *(int *)(lVar1 + 8);
        }
        return 0;
      }
      msgfmt = "Rootfinding was not initialized.";
      error_code = -0x16;
      iVar3 = 0x520;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar3,"ARKodeSetRootDirection",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetRootDirection(void* arkode_mem, int* rootdir)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  int i;

  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;

  if (ark_root_mem->nrtfn == 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_ROOT);
    return (ARK_ILL_INPUT);
  }
  for (i = 0; i < ark_root_mem->nrtfn; i++)
  {
    ark_root_mem->rootdir[i] = rootdir[i];
  }
  return (ARK_SUCCESS);
}